

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SPI.cpp
# Opt level: O1

int __thiscall SPI::open(SPI *this,char *__file,int __oflag,...)

{
  int iVar1;
  invalid_argument *this_00;
  char *pcVar2;
  int *piVar3;
  error_code *peVar4;
  uint in_ECX;
  char spiDev [32];
  uint local_50;
  int local_4c [3];
  undefined8 local_40;
  char local_38 [8];
  undefined8 local_30;
  
  local_50 = in_ECX;
  local_4c[0] = __oflag;
  if (this->_fd != -1) {
    pcVar2 = (char *)__cxa_allocate_exception(0x20);
    local_30 = std::iostream_category();
    local_38[0] = '\x01';
    local_38[1] = '\0';
    local_38[2] = '\0';
    local_38[3] = '\0';
    std::ios_base::failure[abi:cxx11]::failure(pcVar2,(error_code *)"SPI is already opened");
    __cxa_throw(pcVar2,&std::ios_base::failure[abi:cxx11]::typeinfo,
                std::ios_base::failure[abi:cxx11]::~failure);
  }
  if (3 < in_ECX) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"Wrong \'mode\' parameter to open SPI channel");
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  snprintf(local_38,0x20,_spiDevTemplate,(ulong)__file & 0xffffffff);
  iVar1 = ::open(local_38,2);
  this->_fd = iVar1;
  if (iVar1 < 0) {
    pcVar2 = (char *)__cxa_allocate_exception(0x20);
    piVar3 = __errno_location();
    peVar4 = (error_code *)strerror(*piVar3);
    local_40 = std::iostream_category();
    local_4c[1] = 1;
    std::ios_base::failure[abi:cxx11]::failure(pcVar2,peVar4);
    __cxa_throw(pcVar2,&std::ios_base::failure[abi:cxx11]::typeinfo,
                std::ios_base::failure[abi:cxx11]::~failure);
  }
  iVar1 = ioctl(iVar1,0x40016b01,&local_50);
  if (-1 < iVar1) {
    iVar1 = ioctl(this->_fd,0x40016b03,"\b3SPI");
    if (iVar1 < 0) {
      pcVar2 = (char *)__cxa_allocate_exception(0x20);
      piVar3 = __errno_location();
      peVar4 = (error_code *)strerror(*piVar3);
      local_40 = std::iostream_category();
      local_4c[1] = 1;
      std::ios_base::failure[abi:cxx11]::failure(pcVar2,peVar4);
      __cxa_throw(pcVar2,&std::ios_base::failure[abi:cxx11]::typeinfo,
                  std::ios_base::failure[abi:cxx11]::~failure);
    }
    iVar1 = ioctl(this->_fd,0x40046b04,local_4c);
    if (-1 < iVar1) {
      return iVar1;
    }
    pcVar2 = (char *)__cxa_allocate_exception(0x20);
    piVar3 = __errno_location();
    peVar4 = (error_code *)strerror(*piVar3);
    local_40 = std::iostream_category();
    local_4c[1] = 1;
    std::ios_base::failure[abi:cxx11]::failure(pcVar2,peVar4);
    __cxa_throw(pcVar2,&std::ios_base::failure[abi:cxx11]::typeinfo,
                std::ios_base::failure[abi:cxx11]::~failure);
  }
  pcVar2 = (char *)__cxa_allocate_exception(0x20);
  piVar3 = __errno_location();
  peVar4 = (error_code *)strerror(*piVar3);
  local_40 = std::iostream_category();
  local_4c[1] = 1;
  std::ios_base::failure[abi:cxx11]::failure(pcVar2,peVar4);
  __cxa_throw(pcVar2,&std::ios_base::failure[abi:cxx11]::typeinfo,
              std::ios_base::failure[abi:cxx11]::~failure);
}

Assistant:

void SPI::open(int channel, int speed, int mode) {
    if (_fd != -1)
        throw std::ios_base::failure("SPI is already opened");
    if (mode < 0 || mode > 3)
        throw std::invalid_argument("Wrong 'mode' parameter to open SPI channel");
    char spiDev[32];
    ::snprintf(spiDev, sizeof(spiDev), _spiDevTemplate, channel);
    if ((_fd = ::open(spiDev, O_RDWR)) < 0)
        throw std::ios_base::failure(::strerror(errno));
    if (::ioctl(_fd, SPI_IOC_WR_MODE, &mode) < 0)
        throw std::ios_base::failure(::strerror(errno));

    if (::ioctl(_fd, SPI_IOC_WR_BITS_PER_WORD, &_spiBPW) < 0)
        throw std::ios_base::failure(::strerror(errno));

    if (::ioctl(_fd, SPI_IOC_WR_MAX_SPEED_HZ, &speed) < 0)
        throw std::ios_base::failure(::strerror(errno));

}